

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O1

void __thiscall QGraphicsWidgetPrivate::setGeometryFromSetPos(QGraphicsWidgetPrivate *this)

{
  long lVar1;
  QGraphicsItem *pQVar2;
  QGraphicsItem *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)&this->field_0x1b4 >> 10 & 1) == 0) {
    pQVar2 = (this->super_QGraphicsItemPrivate).q_ptr;
    this_00 = pQVar2 + -1;
    if (pQVar2 == (QGraphicsItem *)0x0) {
      this_00 = (QGraphicsItem *)0x0;
    }
    *(ushort *)&this->field_0x1b4 = (ushort)*(uint *)&this->field_0x1b4 | 0x1000;
    QGraphicsWidget::size((QGraphicsWidget *)this_00);
    (*this_00->_vptr_QGraphicsItem[0xc])(this_00);
    this->field_0x1b5 = this->field_0x1b5 & 0xef;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidgetPrivate::setGeometryFromSetPos()
{
    if (inSetGeometry)
        return;
    Q_Q(QGraphicsWidget);
    inSetPos = 1;
    // Ensure setGeometry is called (avoid recursion when setPos is
    // called from within setGeometry).
    q->setGeometry(QRectF(pos, q->size()));
    inSetPos = 0 ;
}